

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall
deqp::gls::AttributePack::render
          (AttributePack *this,Primitive primitive,DrawMethod drawMethod,int firstVertex,
          int vertexCount,IndexType indexType,void *indexOffset,int rangeStart,int rangeEnd,
          int instanceCount,int indirectOffset,int baseVertex,float coordScale,float colorScale,
          AttributeArray *indexArray)

{
  Context *pCVar1;
  float fVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  deUint32 dVar6;
  GLenum GVar7;
  int iVar8;
  size_type sVar9;
  ostream *poVar10;
  undefined8 uVar11;
  reference ppAVar12;
  TestLog *pTVar13;
  MessageBuilder *pMVar14;
  long lVar15;
  undefined8 in_stack_fffffffffffff6c8;
  undefined4 uVar16;
  string local_6e0 [36];
  uint local_6bc;
  stringstream local_6b8 [4];
  deUint32 loc_1;
  stringstream attribName_1;
  ostream local_6a8 [376];
  int local_530;
  uint local_52c;
  int arrayNdx_1;
  GLuint indirectBuf_1;
  float local_3a4;
  uint uStack_3a0;
  DrawCommand_conflict command_1;
  deUint8 *buffer_1;
  undefined1 local_380 [4];
  GLuint indirectBuf;
  float local_200;
  uint uStack_1fc;
  DrawCommand command;
  deUint8 *buffer;
  uint local_1c8;
  deUint32 loc;
  stringstream local_1b8 [8];
  stringstream attribName;
  ostream local_1a8 [376];
  int local_30;
  float local_2c;
  int arrayNdx;
  float colorScale_local;
  float coordScale_local;
  IndexType indexType_local;
  int vertexCount_local;
  int firstVertex_local;
  DrawMethod drawMethod_local;
  Primitive primitive_local;
  AttributePack *this_local;
  
  pCVar1 = this->m_ctx;
  local_2c = colorScale;
  arrayNdx = (int)coordScale;
  colorScale_local = (float)indexType;
  coordScale_local = (float)vertexCount;
  indexType_local = firstVertex;
  vertexCount_local = drawMethod;
  firstVertex_local = primitive;
  _drawMethod_local = this;
  uVar4 = tcu::Surface::getWidth(&this->m_screen);
  uVar5 = tcu::Surface::getHeight(&this->m_screen);
  (*pCVar1->_vptr_Context[5])(pCVar1,0,0,(ulong)uVar4,(ulong)uVar5);
  (*this->m_ctx->_vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*this->m_ctx->_vptr_Context[0x2d])(this->m_ctx,0x4000);
  (*this->m_ctx->_vptr_Context[0x76])(this->m_ctx,(ulong)this->m_programID);
  dVar6 = (*this->m_ctx->_vptr_Context[0x79])();
  glu::checkError(dVar6,"glUseProgram()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                  ,0x78f);
  pCVar1 = this->m_ctx;
  uVar4 = (*this->m_ctx->_vptr_Context[0x66])(this->m_ctx,(ulong)this->m_programID,"u_coordScale");
  (*pCVar1->_vptr_Context[0x5a])(arrayNdx,pCVar1,(ulong)uVar4);
  pCVar1 = this->m_ctx;
  (*this->m_ctx->_vptr_Context[0x66])(this->m_ctx,(ulong)this->m_programID,"u_colorScale");
  (*pCVar1->_vptr_Context[0x5a])(local_2c);
  if ((this->m_useVao & 1U) != 0) {
    (*this->m_ctx->_vptr_Context[0x4b])();
  }
  if (indexArray != (AttributeArray *)0x0) {
    anon_unknown_1::AttributeArray::bindIndexArray(indexArray,TARGET_ELEMENT_ARRAY);
  }
  local_30 = 0;
  while( true ) {
    iVar8 = local_30;
    sVar9 = std::
            vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
            ::size(&this->m_arrays);
    uVar16 = (undefined4)((ulong)in_stack_fffffffffffff6c8 >> 0x20);
    if ((int)sVar9 <= iVar8) break;
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar10 = std::operator<<(local_1a8,"a_");
    std::ostream::operator<<(poVar10,local_30);
    pCVar1 = this->m_ctx;
    uVar4 = this->m_programID;
    std::__cxx11::stringstream::str();
    uVar11 = std::__cxx11::string::c_str();
    uVar4 = (*pCVar1->_vptr_Context[0x59])(pCVar1,(ulong)uVar4,uVar11);
    std::__cxx11::string::~string((string *)&buffer);
    local_1c8 = uVar4;
    ppAVar12 = std::
               vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
               ::operator[](&this->m_arrays,(long)local_30);
    bVar3 = anon_unknown_1::AttributeArray::isBound(*ppAVar12);
    if (bVar3) {
      (*this->m_ctx->_vptr_Context[0x50])(this->m_ctx,(ulong)local_1c8);
      dVar6 = (*this->m_ctx->_vptr_Context[0x79])();
      glu::checkError(dVar6,"glEnableVertexAttribArray()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                      ,0x7a4);
    }
    ppAVar12 = std::
               vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
               ::operator[](&this->m_arrays,(long)local_30);
    anon_unknown_1::AttributeArray::bindAttribute(*ppAVar12,local_1c8);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    local_30 = local_30 + 1;
  }
  if (vertexCount_local == 0) {
    pCVar1 = this->m_ctx;
    GVar7 = anon_unknown_1::primitiveToGL(firstVertex_local);
    (*pCVar1->_vptr_Context[0x68])
              (pCVar1,(ulong)GVar7,(ulong)indexType_local,(ulong)(uint)coordScale_local);
    dVar6 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar6,"glDrawArrays()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x7ad);
  }
  else if (vertexCount_local == 1) {
    pCVar1 = this->m_ctx;
    GVar7 = anon_unknown_1::primitiveToGL(firstVertex_local);
    (*pCVar1->_vptr_Context[0x69])
              (pCVar1,(ulong)GVar7,(ulong)indexType_local,(ulong)(uint)coordScale_local,
               (ulong)(uint)instanceCount);
    dVar6 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar6,"glDrawArraysInstanced()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x7b2);
  }
  else if (vertexCount_local == 3) {
    pCVar1 = this->m_ctx;
    GVar7 = anon_unknown_1::primitiveToGL(firstVertex_local);
    fVar2 = coordScale_local;
    dVar6 = anon_unknown_1::indexTypeToGL((IndexType)colorScale_local);
    (*pCVar1->_vptr_Context[0x6a])(pCVar1,(ulong)GVar7,(ulong)(uint)fVar2,(ulong)dVar6,indexOffset);
    dVar6 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar6,"glDrawElements()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x7b7);
  }
  else if (vertexCount_local == 4) {
    pCVar1 = this->m_ctx;
    GVar7 = anon_unknown_1::primitiveToGL(firstVertex_local);
    fVar2 = coordScale_local;
    dVar6 = anon_unknown_1::indexTypeToGL((IndexType)colorScale_local);
    (*pCVar1->_vptr_Context[0x6e])
              (pCVar1,(ulong)GVar7,(ulong)(uint)rangeStart,(ulong)(uint)rangeEnd,(ulong)(uint)fVar2,
               (ulong)dVar6,indexOffset);
    dVar6 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar6,"glDrawRangeElements()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x7bc);
  }
  else if (vertexCount_local == 5) {
    pCVar1 = this->m_ctx;
    GVar7 = anon_unknown_1::primitiveToGL(firstVertex_local);
    fVar2 = coordScale_local;
    dVar6 = anon_unknown_1::indexTypeToGL((IndexType)colorScale_local);
    (*pCVar1->_vptr_Context[0x6b])
              (pCVar1,(ulong)GVar7,(ulong)(uint)fVar2,(ulong)dVar6,indexOffset,
               (ulong)(uint)instanceCount);
    dVar6 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar6,"glDrawElementsInstanced()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x7c1);
  }
  else if (vertexCount_local == 2) {
    command._8_8_ = operator_new__((long)indirectOffset + 0x10);
    local_200 = coordScale_local;
    uStack_1fc = instanceCount;
    command.count = indexType_local;
    command.primCount = 0;
    *(ulong *)(command._8_8_ + (long)indirectOffset) = CONCAT44(instanceCount,coordScale_local);
    *(ulong *)(command._8_8_ + (long)indirectOffset + 8) = (ulong)indexType_local;
    if ((this->m_logEnabled & 1U) != 0) {
      pTVar13 = tcu::TestContext::getLog(this->m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_380,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar14 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_380,(char (*) [28])"DrawArraysIndirectCommand:\n"
                          );
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [9])"\tcount: ");
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(uint *)&local_200);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0xf12600);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [13])"\tprimCount: ");
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&uStack_1fc);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0xf12600);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [9])"\tfirst: ");
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&command.count);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0xf12600);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [22])"\treservedMustBeZero: ");
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&command.primCount);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0xf12600);
      tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_380);
    }
    buffer_1._4_4_ = 0;
    (*this->m_ctx->_vptr_Context[0x26])(this->m_ctx,1,(long)&buffer_1 + 4);
    (*this->m_ctx->_vptr_Context[0x25])(this->m_ctx,0x8f3f,(ulong)buffer_1._4_4_);
    (*this->m_ctx->_vptr_Context[0x28])
              (this->m_ctx,0x8f3f,(long)indirectOffset + 0x10,command._8_8_,0x88e4);
    if (command._8_8_ != 0) {
      operator_delete__((void *)command._8_8_);
    }
    dVar6 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar6,"Setup draw indirect buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x7e9);
    pCVar1 = this->m_ctx;
    GVar7 = anon_unknown_1::primitiveToGL(firstVertex_local);
    (*pCVar1->_vptr_Context[0x70])(pCVar1,(ulong)GVar7,(ulong)(uint)indirectOffset);
    dVar6 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar6,"glDrawArraysIndirect()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x7ec);
    (*this->m_ctx->_vptr_Context[0x27])(this->m_ctx,1,(long)&buffer_1 + 4);
  }
  else if (vertexCount_local == 6) {
    command_1._12_8_ = operator_new__((long)indirectOffset + 0x14);
    local_3a4 = coordScale_local;
    uStack_3a0 = instanceCount;
    iVar8 = DrawTestSpec::indexTypeSize((IndexType)colorScale_local);
    command_1.count = (GLuint)((long)indexOffset / (long)iVar8);
    command_1.primCount = baseVertex;
    command_1.firstIndex = 0;
    lVar15 = (long)indirectOffset;
    *(ulong *)(command_1._12_8_ + lVar15) = CONCAT44(uStack_3a0,local_3a4);
    *(ulong *)(command_1._12_8_ + 8 + lVar15) = CONCAT44(baseVertex,command_1.count);
    *(undefined4 *)(command_1._12_8_ + 0x10 + lVar15) = 0;
    if ((this->m_logEnabled & 1U) != 0) {
      pTVar13 = tcu::TestContext::getLog(this->m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&arrayNdx_1,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar14 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&arrayNdx_1,
                           (char (*) [30])"DrawElementsIndirectCommand:\n");
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [9])"\tcount: ");
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(uint *)&local_3a4);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0xf12600);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [13])"\tprimCount: ");
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&uStack_3a0);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0xf12600);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [14])"\tfirstIndex: ");
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&command_1.count);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0xf12600);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [14])"\tbaseVertex: ");
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(int *)&command_1.primCount);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0xf12600);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [22])"\treservedMustBeZero: ");
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&command_1.firstIndex);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0xf12600);
      tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&arrayNdx_1);
    }
    local_52c = 0;
    (*this->m_ctx->_vptr_Context[0x26])(this->m_ctx,1,&local_52c);
    (*this->m_ctx->_vptr_Context[0x25])(this->m_ctx,0x8f3f,(ulong)local_52c);
    (*this->m_ctx->_vptr_Context[0x28])
              (this->m_ctx,0x8f3f,(long)indirectOffset + 0x14,command_1._12_8_,0x88e4);
    if (command_1._12_8_ != 0) {
      operator_delete__((void *)command_1._12_8_);
    }
    dVar6 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar6,"Setup draw indirect buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x81c);
    pCVar1 = this->m_ctx;
    GVar7 = anon_unknown_1::primitiveToGL(firstVertex_local);
    dVar6 = anon_unknown_1::indexTypeToGL((IndexType)colorScale_local);
    (*pCVar1->_vptr_Context[0x71])(pCVar1,(ulong)GVar7,(ulong)dVar6,(ulong)(uint)indirectOffset);
    dVar6 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar6,"glDrawArraysIndirect()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x81f);
    (*this->m_ctx->_vptr_Context[0x27])(this->m_ctx,1,&local_52c);
  }
  else if (vertexCount_local == 7) {
    pCVar1 = this->m_ctx;
    GVar7 = anon_unknown_1::primitiveToGL(firstVertex_local);
    fVar2 = coordScale_local;
    dVar6 = anon_unknown_1::indexTypeToGL((IndexType)colorScale_local);
    (*pCVar1->_vptr_Context[0x6c])
              (pCVar1,(ulong)GVar7,(ulong)(uint)fVar2,(ulong)dVar6,indexOffset,
               (ulong)(uint)baseVertex);
    dVar6 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar6,"glDrawElementsBaseVertex()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x826);
  }
  else if (vertexCount_local == 8) {
    pCVar1 = this->m_ctx;
    GVar7 = anon_unknown_1::primitiveToGL(firstVertex_local);
    fVar2 = coordScale_local;
    dVar6 = anon_unknown_1::indexTypeToGL((IndexType)colorScale_local);
    (*pCVar1->_vptr_Context[0x6d])
              (pCVar1,(ulong)GVar7,(ulong)(uint)fVar2,(ulong)dVar6,indexOffset,
               (ulong)(uint)instanceCount,CONCAT44(uVar16,baseVertex));
    dVar6 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar6,"glDrawElementsInstancedBaseVertex()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x82b);
  }
  else if (vertexCount_local == 9) {
    pCVar1 = this->m_ctx;
    GVar7 = anon_unknown_1::primitiveToGL(firstVertex_local);
    fVar2 = coordScale_local;
    dVar6 = anon_unknown_1::indexTypeToGL((IndexType)colorScale_local);
    (*pCVar1->_vptr_Context[0x6f])
              (pCVar1,(ulong)GVar7,(ulong)(uint)rangeStart,(ulong)(uint)rangeEnd,(ulong)(uint)fVar2,
               (ulong)dVar6,indexOffset,baseVertex);
    dVar6 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar6,"glDrawRangeElementsBaseVertex()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x830);
  }
  for (local_530 = 0; iVar8 = local_530,
      sVar9 = std::
              vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
              ::size(&this->m_arrays), iVar8 < (int)sVar9; local_530 = local_530 + 1) {
    ppAVar12 = std::
               vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
               ::operator[](&this->m_arrays,(long)local_530);
    bVar3 = anon_unknown_1::AttributeArray::isBound(*ppAVar12);
    if (bVar3) {
      std::__cxx11::stringstream::stringstream(local_6b8);
      poVar10 = std::operator<<(local_6a8,"a_");
      std::ostream::operator<<(poVar10,local_530);
      pCVar1 = this->m_ctx;
      uVar4 = this->m_programID;
      std::__cxx11::stringstream::str();
      uVar11 = std::__cxx11::string::c_str();
      uVar4 = (*pCVar1->_vptr_Context[0x59])(pCVar1,(ulong)uVar4,uVar11);
      std::__cxx11::string::~string(local_6e0);
      local_6bc = uVar4;
      (*this->m_ctx->_vptr_Context[0x51])(this->m_ctx,(ulong)uVar4);
      dVar6 = (*this->m_ctx->_vptr_Context[0x79])();
      glu::checkError(dVar6,"glDisableVertexAttribArray()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                      ,0x83f);
      std::__cxx11::stringstream::~stringstream(local_6b8);
    }
  }
  if ((this->m_useVao & 1U) != 0) {
    (*this->m_ctx->_vptr_Context[0x4b])(this->m_ctx,0);
  }
  (*this->m_ctx->_vptr_Context[0x76])(this->m_ctx,0);
  pCVar1 = this->m_ctx;
  uVar4 = tcu::Surface::getWidth(&this->m_screen);
  uVar5 = tcu::Surface::getHeight(&this->m_screen);
  (*pCVar1->_vptr_Context[0x80])(pCVar1,&this->m_screen,0,0,(ulong)uVar4,(ulong)uVar5);
  return;
}

Assistant:

void AttributePack::render (DrawTestSpec::Primitive primitive, DrawTestSpec::DrawMethod drawMethod, int firstVertex, int vertexCount, DrawTestSpec::IndexType indexType, const void* indexOffset, int rangeStart, int rangeEnd, int instanceCount, int indirectOffset, int baseVertex, float coordScale, float colorScale, AttributeArray* indexArray)
{
	DE_ASSERT(m_program != DE_NULL);
	DE_ASSERT(m_programID != 0);

	m_ctx.viewport(0, 0, m_screen.getWidth(), m_screen.getHeight());
	m_ctx.clearColor(0.0, 0.0, 0.0, 1.0);
	m_ctx.clear(GL_COLOR_BUFFER_BIT);

	m_ctx.useProgram(m_programID);
	GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glUseProgram()");

	m_ctx.uniform1f(m_ctx.getUniformLocation(m_programID, "u_coordScale"), coordScale);
	m_ctx.uniform1f(m_ctx.getUniformLocation(m_programID, "u_colorScale"), colorScale);

	if (m_useVao)
		m_ctx.bindVertexArray(m_vaoID);

	if (indexArray)
		indexArray->bindIndexArray(DrawTestSpec::TARGET_ELEMENT_ARRAY);

	for (int arrayNdx = 0; arrayNdx < (int)m_arrays.size(); arrayNdx++)
	{
		std::stringstream attribName;
		attribName << "a_" << arrayNdx;

		deUint32 loc = m_ctx.getAttribLocation(m_programID, attribName.str().c_str());

		if (m_arrays[arrayNdx]->isBound())
		{
			m_ctx.enableVertexAttribArray(loc);
			GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glEnableVertexAttribArray()");
		}

		m_arrays[arrayNdx]->bindAttribute(loc);
	}

	if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWARRAYS)
	{
		m_ctx.drawArrays(primitiveToGL(primitive), firstVertex, vertexCount);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawArrays()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INSTANCED)
	{
		m_ctx.drawArraysInstanced(primitiveToGL(primitive), firstVertex, vertexCount, instanceCount);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawArraysInstanced()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS)
	{
		m_ctx.drawElements(primitiveToGL(primitive), vertexCount, indexTypeToGL(indexType), indexOffset);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawElements()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED)
	{
		m_ctx.drawRangeElements(primitiveToGL(primitive), rangeStart, rangeEnd, vertexCount, indexTypeToGL(indexType), indexOffset);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawRangeElements()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED)
	{
		m_ctx.drawElementsInstanced(primitiveToGL(primitive), vertexCount, indexTypeToGL(indexType), indexOffset, instanceCount);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawElementsInstanced()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INDIRECT)
	{
		struct DrawCommand
		{
			GLuint count;
			GLuint primCount;
			GLuint first;
			GLuint reservedMustBeZero;
		};
		deUint8* buffer = new deUint8[sizeof(DrawCommand) + indirectOffset];

		{
			DrawCommand command;

			command.count				= vertexCount;
			command.primCount			= instanceCount;
			command.first				= firstVertex;
			command.reservedMustBeZero	= 0;

			memcpy(buffer + indirectOffset, &command, sizeof(command));

			if (m_logEnabled)
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "DrawArraysIndirectCommand:\n"
					<< "\tcount: " << command.count << "\n"
					<< "\tprimCount: " << command.primCount << "\n"
					<< "\tfirst: " << command.first << "\n"
					<< "\treservedMustBeZero: " << command.reservedMustBeZero << "\n"
					<< tcu::TestLog::EndMessage;
		}

		GLuint indirectBuf = 0;
		m_ctx.genBuffers(1, &indirectBuf);
		m_ctx.bindBuffer(GL_DRAW_INDIRECT_BUFFER, indirectBuf);
		m_ctx.bufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawCommand) + indirectOffset, buffer, GL_STATIC_DRAW);
		delete [] buffer;

		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "Setup draw indirect buffer");

		m_ctx.drawArraysIndirect(primitiveToGL(primitive), (const deInt8*)DE_NULL + indirectOffset);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawArraysIndirect()");

		m_ctx.deleteBuffers(1, &indirectBuf);
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INDIRECT)
	{
		struct DrawCommand
		{
			GLuint count;
			GLuint primCount;
			GLuint firstIndex;
			GLint  baseVertex;
			GLuint reservedMustBeZero;
		};
		deUint8* buffer = new deUint8[sizeof(DrawCommand) + indirectOffset];

		{
			DrawCommand command;

			// index offset must be converted to firstIndex by dividing with the index element size
			DE_ASSERT(((const deUint8*)indexOffset - (const deUint8*)DE_NULL) % gls::DrawTestSpec::indexTypeSize(indexType) == 0); // \note This is checked in spec validation

			command.count				= vertexCount;
			command.primCount			= instanceCount;
			command.firstIndex			= (glw::GLuint)(((const deUint8*)indexOffset - (const deUint8*)DE_NULL) / gls::DrawTestSpec::indexTypeSize(indexType));
			command.baseVertex			= baseVertex;
			command.reservedMustBeZero	= 0;

			memcpy(buffer + indirectOffset, &command, sizeof(command));

			if (m_logEnabled)
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "DrawElementsIndirectCommand:\n"
					<< "\tcount: " << command.count << "\n"
					<< "\tprimCount: " << command.primCount << "\n"
					<< "\tfirstIndex: " << command.firstIndex << "\n"
					<< "\tbaseVertex: " << command.baseVertex << "\n"
					<< "\treservedMustBeZero: " << command.reservedMustBeZero << "\n"
					<< tcu::TestLog::EndMessage;
		}

		GLuint indirectBuf = 0;
		m_ctx.genBuffers(1, &indirectBuf);
		m_ctx.bindBuffer(GL_DRAW_INDIRECT_BUFFER, indirectBuf);
		m_ctx.bufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawCommand) + indirectOffset, buffer, GL_STATIC_DRAW);
		delete [] buffer;

		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "Setup draw indirect buffer");

		m_ctx.drawElementsIndirect(primitiveToGL(primitive), indexTypeToGL(indexType), (const deInt8*)DE_NULL + indirectOffset);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawArraysIndirect()");

		m_ctx.deleteBuffers(1, &indirectBuf);
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_BASEVERTEX)
	{
		m_ctx.drawElementsBaseVertex(primitiveToGL(primitive), vertexCount, indexTypeToGL(indexType), indexOffset, baseVertex);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawElementsBaseVertex()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX)
	{
		m_ctx.drawElementsInstancedBaseVertex(primitiveToGL(primitive), vertexCount, indexTypeToGL(indexType), indexOffset, instanceCount, baseVertex);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawElementsInstancedBaseVertex()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX)
	{
		m_ctx.drawRangeElementsBaseVertex(primitiveToGL(primitive), rangeStart, rangeEnd, vertexCount, indexTypeToGL(indexType), indexOffset, baseVertex);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawRangeElementsBaseVertex()");
	}
	else
		DE_ASSERT(DE_FALSE);

	for (int arrayNdx = 0; arrayNdx < (int)m_arrays.size(); arrayNdx++)
	{
		if (m_arrays[arrayNdx]->isBound())
		{
			std::stringstream attribName;
			attribName << "a_" << arrayNdx;

			deUint32 loc = m_ctx.getAttribLocation(m_programID, attribName.str().c_str());

			m_ctx.disableVertexAttribArray(loc);
			GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDisableVertexAttribArray()");
		}
	}

	if (m_useVao)
		m_ctx.bindVertexArray(0);

	m_ctx.useProgram(0);
	m_ctx.readPixels(m_screen, 0, 0, m_screen.getWidth(), m_screen.getHeight());
}